

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::internal::error_handler>::char_writer>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,char_writer *f)

{
  uint uVar1;
  undefined8 *puVar2;
  long lVar3;
  byte bVar4;
  char *in_RAX;
  char *unaff_RBX;
  ulong uVar5;
  char *pcVar6;
  fill_t<char> *fill;
  size_t n;
  
  uVar1 = specs->width;
  if ((long)(int)uVar1 < 0) {
    assert_fail(unaff_RBX,0,in_RAX);
  }
  if (uVar1 < 2) {
    puVar2 = *(undefined8 **)this;
    lVar3 = puVar2[2];
    uVar5 = lVar3 + 1;
    if ((ulong)puVar2[3] < uVar5) {
      (**(code **)*puVar2)(puVar2,uVar5);
    }
    puVar2[2] = uVar5;
    *(char_type *)(puVar2[1] + lVar3) = f->value;
    return;
  }
  n = (long)(int)uVar1 - 1;
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  uVar5 = (specs->fill).size_ * n + lVar3 + 1;
  if ((ulong)puVar2[3] < uVar5) {
    (**(code **)*puVar2)(puVar2,uVar5);
  }
  puVar2[2] = uVar5;
  pcVar6 = (char *)(lVar3 + puVar2[1]);
  fill = &specs->fill;
  bVar4 = specs->field_0x9 & 0xf;
  if (bVar4 == 3) {
    pcVar6 = fill<char*,char>(pcVar6,n >> 1,fill);
    *pcVar6 = f->value;
    n = n - (n >> 1);
  }
  else {
    if (bVar4 == 2) {
      pcVar6 = fill<char*,char>(pcVar6,n,fill);
      *pcVar6 = f->value;
      return;
    }
    *pcVar6 = f->value;
  }
  fill<char*,char>(pcVar6 + 1,n,fill);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }